

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

void __thiscall
sglr::rc::ObjectManager<sglr::rc::DataBuffer>::getAll
          (ObjectManager<sglr::rc::DataBuffer> *this,
          vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *objects)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  pointer ppDVar2;
  
  std::vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::resize
            (objects,(this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ppDVar2 = (objects->
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  for (p_Var1 = (this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    *ppDVar2 = (DataBuffer *)p_Var1[1]._M_parent;
    ppDVar2 = ppDVar2 + 1;
  }
  return;
}

Assistant:

void ObjectManager<T>::getAll (typename std::vector<T*>& objects) const
{
	objects.resize(m_objects.size());
	typename std::vector<T*>::iterator dst = objects.begin();

	for (typename std::map<deUint32, T*>::const_iterator i = m_objects.begin();
		 i != m_objects.end(); i++)
	{
		*dst++ = i->second;
	}
}